

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

int main(void)

{
  list<Quaternion,_std::allocator<Quaternion>_> *this;
  pointer pPVar1;
  int iVar2;
  size_t __new_size;
  ostream *poVar3;
  int i;
  ulong uVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  Image image_out;
  SpanBytesConst deserialize_ptr;
  SpanBytes serialize_ptr;
  Image local_e0;
  
  local_e0.name._M_dataplus._M_p = (pointer)&local_e0.name.field_2;
  local_e0.name._M_string_length = 0;
  local_e0.name.field_2._M_local_buf[0] = '\0';
  local_e0.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = &local_e0.quats;
  local_e0.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node._M_size =
       0;
  local_e0.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  local_e0.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  std::__cxx11::string::assign((char *)&local_e0.name);
  local_e0.width = 0x280;
  local_e0.height = 0x1e0;
  image_out._0_8_ = image_out._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&local_e0.data,0x4b000,(value_type_conflict *)&image_out);
  local_e0.pose.pos.x = 1.0;
  local_e0.pose.pos.y = 2.0;
  local_e0.pose.pos.z = 3.0;
  local_e0.pose.rot.x = 0.1;
  local_e0.pose.rot.y = 0.2;
  local_e0.pose.rot.z = 0.3;
  local_e0.pose.rot.w = 0.4;
  local_e0.array._M_elems[0] = 0x2a;
  local_e0.array._M_elems[1] = 0x45;
  iVar5 = 4;
  iVar2 = 0;
  while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
    image_out._0_8_ = (BADTYPE)iVar2;
    image_out.name._M_dataplus._M_p = (pointer)(double)(iVar2 + 1);
    image_out.name._M_string_length = (size_type)(double)(iVar2 + 2);
    std::vector<Point3D,_std::allocator<Point3D>_>::emplace_back<Point3D>
              (&local_e0.points,(Point3D *)&image_out);
    image_out.width = -0x66666666;
    image_out.height = 0x3fb99999;
    image_out.name._M_dataplus._M_p = (pointer)0xbfc999999999999a;
    image_out.name._M_string_length = 0x3fd3333333333333;
    image_out.name.field_2._M_allocated_capacity = 0xbfd999999999999a;
    std::__cxx11::list<Quaternion,_std::allocator<Quaternion>_>::push_back
              (this,(value_type *)&image_out);
    iVar2 = iVar2 + 1;
  }
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size = SerializeMe::BufferSize<Image>(&local_e0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&buffer,__new_size);
  serialize_ptr.data_ =
       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  serialize_ptr.size_ =
       (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  SerializeMe::SerializeIntoBuffer<Image>(&serialize_ptr,&local_e0);
  image_out.name._M_dataplus._M_p = (pointer)&image_out.name.field_2;
  image_out.name._M_string_length = 0;
  image_out.name.field_2._M_allocated_capacity =
       image_out.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
  image_out.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  image_out.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  image_out.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  image_out.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&image_out.quats;
  image_out.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node._M_size
       = 0;
  image_out.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  image_out.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  image_out.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deserialize_ptr.size_ =
       (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  deserialize_ptr.data_ =
       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  image_out.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       image_out.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node.
       super__List_node_base._M_next;
  SerializeMe::DeserializeFromBuffer<Image>(&deserialize_ptr,&image_out);
  poVar3 = std::operator<<((ostream *)&std::cout,"Image name: ");
  poVar3 = std::operator<<(poVar3,(string *)&image_out.name);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Image width: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,image_out.width);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Image height: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,image_out.height);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Pixels count: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,"Pose/pos: ");
  poVar3 = std::ostream::_M_insert<double>(image_out.pose.pos.x);
  std::operator<<(poVar3,", ");
  poVar3 = std::ostream::_M_insert<double>(image_out.pose.pos.y);
  std::operator<<(poVar3,", ");
  poVar3 = std::ostream::_M_insert<double>(image_out.pose.pos.z);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,"Pose/rot: ");
  poVar3 = std::ostream::_M_insert<double>(image_out.pose.rot.x);
  std::operator<<(poVar3,", ");
  poVar3 = std::ostream::_M_insert<double>(image_out.pose.rot.y);
  std::operator<<(poVar3,", ");
  poVar3 = std::ostream::_M_insert<double>(image_out.pose.rot.z);
  std::operator<<(poVar3,", ");
  poVar3 = std::ostream::_M_insert<double>(image_out.pose.rot.w);
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar6 = 0x10;
  for (uVar4 = 0;
      pPVar1 = image_out.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)image_out.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)image_out.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x18); uVar4 = uVar4 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Point[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar4);
    std::operator<<(poVar3,"]: ");
    poVar3 = std::ostream::_M_insert<double>(*(double *)((long)pPVar1 + lVar6 + -0x10));
    std::operator<<(poVar3,", ");
    poVar3 = std::ostream::_M_insert<double>(*(double *)((long)pPVar1 + lVar6 + -8));
    std::operator<<(poVar3,", ");
    poVar3 = std::ostream::_M_insert<double>(*(double *)((long)&pPVar1->x + lVar6));
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar6 = lVar6 + 0x18;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Buffer size: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  Image::~Image(&image_out);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  Image::~Image(&local_e0);
  return 0;
}

Assistant:

int main()
{
  Image image;

  image.name = "pepito";
  image.width = 640;
  image.height = 480;
  image.data.resize(image.width * image.height, 0);
  image.pose.pos = {1, 2, 3};
  image.pose.rot = {0.1, 0.2, 0.3, 0.4};
  image.array = {42, 69};
  for (int i = 0; i < 4; i++)
  {
    image.points.push_back(Point3D{double(i), double(i + 1), double(i + 2)});
    image.quats.push_back({0.1, -0.2, 0.3, -0.4});
  }

  //--- This is the serialized buffer. Allocate memory manually -----
  std::vector<uint8_t> buffer;
  size_t size = SerializeMe::BufferSize(image);
  buffer.resize(size);

  //------ Serialize into the buffer -----
  SerializeMe::SpanBytes serialize_ptr(buffer);
  SerializeMe::SerializeIntoBuffer(serialize_ptr, image);

  //------ Deserialize from buffer to image -----
  Image image_out;
  SerializeMe::SpanBytesConst deserialize_ptr(buffer.data(), buffer.size());
  SerializeMe::DeserializeFromBuffer(deserialize_ptr, image_out);

  //------ Check results -------
  std::cout << "Image name: " << image_out.name << std::endl;
  std::cout << "Image width: " << image_out.width << std::endl;
  std::cout << "Image height: " << image_out.height << std::endl;
  std::cout << "Pixels count: " << image_out.data.size() << std::endl;

  std::cout << "Pose/pos: " << image_out.pose.pos.x << ", " << image_out.pose.pos.y
            << ", " << image_out.pose.pos.z << std::endl;

  std::cout << "Pose/rot: " << image_out.pose.rot.x << ", " << image_out.pose.rot.y
            << ", " << image_out.pose.rot.z << ", " << image_out.pose.rot.w << std::endl;

  for (int i = 0; i < image_out.points.size(); i++)
  {
    const auto& p = image_out.points[i];
    std::cout << "Point[" << i << "]: " << p.x << ", " << p.y << ", " << p.z << std::endl;
  }

  std::cout << "Buffer size: " << buffer.size() << std::endl;

  return 0;
}